

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgenPeeps.cpp
# Opt level: O1

bool __thiscall AgenPeeps::DependentOpnds(AgenPeeps *this,Opnd *opnd1,Opnd *opnd2)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  StackSym *pSVar6;
  Opnd *pOVar7;
  Opnd *pOVar8;
  
  if (opnd2 == (Opnd *)0x0 || opnd1 == (Opnd *)0x0) {
    return false;
  }
  bVar3 = IsMemoryOpnd(this,opnd1);
  if ((bVar3) && (bVar3 = IsMemoryOpnd(this,opnd2), bVar3)) {
    OVar4 = IR::Opnd::GetKind(opnd1);
    if (OVar4 == OpndKindSym) {
      OVar4 = IR::Opnd::GetKind(opnd1);
      pOVar7 = opnd1;
      if (OVar4 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar3) goto LAB_00655c1e;
        *puVar5 = 0;
      }
    }
    else {
      pOVar7 = (Opnd *)0x0;
    }
    OVar4 = IR::Opnd::GetKind(opnd2);
    if (OVar4 == OpndKindSym) {
      OVar4 = IR::Opnd::GetKind(opnd2);
      pOVar8 = opnd2;
      if (OVar4 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar3) goto LAB_00655c1e;
        *puVar5 = 0;
      }
    }
    else {
      pOVar8 = (Opnd *)0x0;
    }
    if (pOVar7 == (Opnd *)0x0 && pOVar8 == (Opnd *)0x0) {
      return true;
    }
    OVar4 = IR::Opnd::GetKind(opnd1);
    if (OVar4 == OpndKindMemRef) {
      return false;
    }
    OVar4 = IR::Opnd::GetKind(opnd2);
    if (OVar4 == OpndKindMemRef) {
      return false;
    }
    OVar4 = IR::Opnd::GetKind(opnd1);
    if (OVar4 == OpndKindIndir) {
      return false;
    }
    OVar4 = IR::Opnd::GetKind(opnd2);
    if (OVar4 == OpndKindIndir) {
      return false;
    }
    if (pOVar7 == (Opnd *)0x0 || pOVar8 == (Opnd *)0x0) {
      return true;
    }
    if (((Sym *)pOVar7[1]._vptr_Opnd)->m_kind != SymKindStack) {
      return true;
    }
    if (*(char *)((long)pOVar8[1]._vptr_Opnd + 0x14) != '\x01') {
      return true;
    }
    pSVar6 = Sym::AsStackSym((Sym *)pOVar7[1]._vptr_Opnd);
    iVar1 = pSVar6->m_offset;
    pSVar6 = Sym::AsStackSym((Sym *)pOVar8[1]._vptr_Opnd);
    return iVar1 == pSVar6->m_offset;
  }
  OVar4 = IR::Opnd::GetKind(opnd1);
  if (OVar4 == OpndKindReg) {
    OVar4 = IR::Opnd::GetKind(opnd1);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_00655c1e;
      *puVar5 = 0;
    }
    OVar4 = IR::Opnd::GetKind(opnd2);
    if (OVar4 == OpndKindReg) {
      OVar4 = IR::Opnd::GetKind(opnd2);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar3) goto LAB_00655c1e;
        *puVar5 = 0;
      }
      bVar3 = IR::RegOpnd::IsSameRegUntyped((RegOpnd *)opnd1,opnd2);
      if (bVar3) {
        return true;
      }
    }
    OVar4 = IR::Opnd::GetKind(opnd2);
    if (OVar4 == OpndKindIndir) {
      OVar4 = IR::Opnd::GetKind(opnd2);
      if (OVar4 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar3) goto LAB_00655c1e;
        *puVar5 = 0;
      }
      pOVar7 = (Opnd *)opnd2[1]._vptr_Opnd;
      OVar4 = IR::Opnd::GetKind(opnd2);
      if (OVar4 != OpndKindIndir) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
        if (!bVar3) goto LAB_00655c1e;
        *puVar5 = 0;
      }
      pOVar8 = *(Opnd **)&opnd2[1].m_valueType;
      if ((pOVar7 != (Opnd *)0x0) &&
         (bVar3 = IR::RegOpnd::IsSameRegUntyped((RegOpnd *)opnd1,pOVar7), bVar3)) {
        return true;
      }
      if ((pOVar8 != (Opnd *)0x0) &&
         (bVar3 = IR::RegOpnd::IsSameRegUntyped((RegOpnd *)opnd1,pOVar8), bVar3)) {
        return true;
      }
    }
    OVar4 = IR::Opnd::GetKind(opnd2);
    if (OVar4 == OpndKindSym) {
      OVar4 = IR::Opnd::GetKind(opnd2);
      if (OVar4 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar3) goto LAB_00655c1e;
        *puVar5 = 0;
      }
      if ((*(char *)((long)opnd2[1]._vptr_Opnd + 0x14) == '\x01') &&
         (*(byte *)((long)&opnd1[1].m_valueType.field_0.bits + 1) == 6)) {
        return true;
      }
    }
  }
  OVar4 = IR::Opnd::GetKind(opnd2);
  if (OVar4 != OpndKindReg) {
    return false;
  }
  OVar4 = IR::Opnd::GetKind(opnd2);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_00655c1e;
    *puVar5 = 0;
  }
  OVar4 = IR::Opnd::GetKind(opnd1);
  if (OVar4 == OpndKindIndir) {
    OVar4 = IR::Opnd::GetKind(opnd1);
    if (OVar4 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar3) goto LAB_00655c1e;
      *puVar5 = 0;
    }
    pOVar7 = (Opnd *)opnd1[1]._vptr_Opnd;
    OVar4 = IR::Opnd::GetKind(opnd1);
    if (OVar4 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar3) goto LAB_00655c1e;
      *puVar5 = 0;
    }
    pOVar8 = *(Opnd **)&opnd1[1].m_valueType;
    if ((pOVar7 != (Opnd *)0x0) &&
       (bVar3 = IR::RegOpnd::IsSameRegUntyped((RegOpnd *)opnd2,pOVar7), bVar3)) {
      return true;
    }
    if ((pOVar8 != (Opnd *)0x0) &&
       (bVar3 = IR::RegOpnd::IsSameRegUntyped((RegOpnd *)opnd2,pOVar8), bVar3)) {
      return true;
    }
  }
  OVar4 = IR::Opnd::GetKind(opnd1);
  if (OVar4 != OpndKindSym) {
    return false;
  }
  OVar4 = IR::Opnd::GetKind(opnd1);
  if (OVar4 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar3) {
LAB_00655c1e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (*(char *)((long)opnd1[1]._vptr_Opnd + 0x14) != '\x01') {
    return false;
  }
  if (*(byte *)((long)&opnd2[1].m_valueType.field_0.bits + 1) == 6) {
    return true;
  }
  return false;
}

Assistant:

bool AgenPeeps::DependentOpnds(IR::Opnd *opnd1, IR::Opnd *opnd2)
{
#if defined (_M_IX86)
    const RegNum baseReg = RegEBP;
#elif defined (_M_X64)
    const RegNum baseReg = RegRBP;
#else
    AssertMsg(false, "Optimization not supported for ARM");
#endif

    if (!opnd1 || !opnd2)
        return false;

    // Memory dependence
    if (IsMemoryOpnd(opnd1) && IsMemoryOpnd(opnd2))
    {
        IR::SymOpnd *symOpnd1 = opnd1->IsSymOpnd() ? opnd1->AsSymOpnd() : nullptr;
        IR::SymOpnd *symOpnd2 = opnd2->IsSymOpnd() ? opnd2->AsSymOpnd() : nullptr;

        if (symOpnd1 || symOpnd2)
        {
            // SymOpnd do not alias with  MemRefOpnd/IndirOpnd
            if (opnd1->IsMemRefOpnd() || opnd2->IsMemRefOpnd() || opnd1->IsIndirOpnd() || opnd2->IsIndirOpnd())
                return false;

            // Two symOpnds are dependent if they point to the same stack symbol
            if (symOpnd1 && symOpnd2 &&
                symOpnd1->m_sym->IsStackSym() && symOpnd2->m_sym->IsStackSym() )
            {
                return symOpnd1->m_sym->AsStackSym()->m_offset == symOpnd2->m_sym->AsStackSym()->m_offset;
            }
        }
        // all other memory operands are dependent
        return true;
    }

    IR::RegOpnd *regOpnd, *base, *index;

    // Register dependences
    if (opnd1->IsRegOpnd())
    {
        regOpnd = opnd1->AsRegOpnd();
        // reg-to-reg
        if (opnd2->IsRegOpnd() && regOpnd->IsSameRegUntyped(opnd2->AsRegOpnd()))
            return true;

        // opnd2 = [base + indx + offset] and (opnd1 = base or opnd1 = indx)
        if (opnd2->IsIndirOpnd())
        {
            base = opnd2->AsIndirOpnd()->GetBaseOpnd();
            index = opnd2->AsIndirOpnd()->GetIndexOpnd();
            if ( (base && regOpnd->IsSameRegUntyped(base)) || (index && regOpnd->IsSameRegUntyped(index)) )
                return true;
        }
        // opnd1 = ebp/rbp and opnd2 = [ebp/rbp + offset]
        if (opnd2->IsSymOpnd() && opnd2->AsSymOpnd()->m_sym->IsStackSym() && regOpnd->GetReg() == baseReg)
            return true;
    }

    if (opnd2->IsRegOpnd())
    {
        regOpnd = opnd2->AsRegOpnd();

        // opnd1 = [base + indx + offset] and (opnd2 = base or opnd2 = indx)
        if (opnd1->IsIndirOpnd())
        {
            base = opnd1->AsIndirOpnd()->GetBaseOpnd();
            index = opnd1->AsIndirOpnd()->GetIndexOpnd();
            if ( (base && regOpnd->IsSameRegUntyped(base)) || (index && regOpnd->IsSameRegUntyped(index)) )
                return true;
        }

        // opnd2 = ebp/rbp and opnd1 = [ebp/rbp + offset]
        if (opnd1->IsSymOpnd() && opnd1->AsSymOpnd()->m_sym->IsStackSym() && regOpnd->GetReg() == baseReg)
            return true;
    }
    return false;
}